

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

value_type * __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeLast
          (value_type *__return_storage_ptr__,
          QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this)

{
  qsizetype *pqVar1;
  iterator iVar2;
  
  __return_storage_ptr__->second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->first).d.d.ptr = (QHttpNetworkRequestPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  iVar2 = end(this);
  QHttpNetworkRequest::QHttpNetworkRequest(&__return_storage_ptr__->first,&iVar2.i[-1].first);
  __return_storage_ptr__->second = iVar2.i[-1].second;
  QHttpNetworkRequest::~QHttpNetworkRequest(&(this->d).ptr[(this->d).size + -1].first);
  pqVar1 = &(this->d).size;
  *pqVar1 = *pqVar1 + -1;
  return __return_storage_ptr__;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }